

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O0

string * __thiscall qclab::qasm_abi_cxx11_(string *__return_storage_ptr__,qclab *this,float angle)

{
  ulong uVar1;
  allocator local_2d;
  int local_2c;
  char local_28 [4];
  int size;
  char buffer [16];
  float angle_local;
  
  buffer._12_4_ = angle;
  local_2c = sprintf(local_28,"%.7f",(double)angle);
  uVar1 = (ulong)local_2c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_28,uVar1,&local_2d);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm( const float angle ) {
    char buffer[16] ;
    int size = std::sprintf( buffer , "%.7f" , angle ) ;
    return std::string( buffer , size ) ;
  }